

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O1

void dist_single_run<double,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>,std::uniform_real_distribution<double>>
               (uniform_real_distribution<double> *dist,
               linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *generator,
               size_t times)

{
  double dVar1;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar2;
  double dVar3;
  
  if (times != 0) {
    dVar3 = 0.0;
    do {
      dVar2 = std::
              generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                        (generator);
      dVar1 = (dist->_M_param)._M_a;
      dVar3 = dVar3 + dVar1 + ((dist->_M_param)._M_b - dVar1) * dVar2;
      times = times - 1;
    } while (times != 0);
    if (dVar3 != 0.0) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"This is to avoid compiler optimizations.",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void dist_single_run (D& dist, G& generator, size_t times ) {
    Real total = 0.0;

    for ( size_t i = 0; i < times; ++i )
        total += dist(generator);

    if ( total == 0 ) cout << "This is to avoid compiler optimizations." << endl;
}